

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
ModsIRCCommand::trigger
          (ModsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  ShowModsIRCCommand *this_00;
  size_t sVar7;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *pcVar8;
  uint uVar9;
  undefined8 *puVar10;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string_view nick_00;
  string_view staff_word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  IRC_Bot *local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined8 local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar8 = nick._M_str;
  sVar7 = nick._M_len;
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  rhs._M_str = "show";
  rhs._M_len = 4;
  this_00 = (ShowModsIRCCommand *)parameters._M_len;
  bVar1 = jessilib::equalsi<char,char>(parameters,rhs);
  if (!bVar1) {
    lVar3 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
    if (lVar3 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_80._M_len = pluginInstance.m_staffTitle._M_string_length;
      local_80._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
      uVar9 = 0;
      local_88 = source;
      while( true ) {
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        if (uVar4 == uVar9) break;
        uVar4 = RenX::getCore();
        lVar3 = RenX::Core::getServer(uVar4);
        cVar2 = RenX::Server::isLogChanType((int)lVar3);
        if (cVar2 != '\0') {
          args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_a8,0,local_a8._M_string_length,"",0);
          if (*(long *)(lVar3 + 0x20) != 0) {
            for (puVar10 = *(undefined8 **)(lVar3 + 0x10); puVar10 != (undefined8 *)(lVar3 + 0x10);
                puVar10 = (undefined8 *)*puVar10) {
              if ((*(char *)(puVar10 + 0x22) == '\0') &&
                 ((puVar10[0xc] != 0 ||
                  ((*(int *)(puVar10 + 0x38) != 0 && ((puVar10[0x31] != 0 || (puVar10[0x35] != 0))))
                  )))) {
                if (local_a8._M_string_length == 0) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_a8,local_80._M_str,local_80._M_len);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_a8,"s in-game: ",0xb);
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_a8,", ");
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_a8,(char *)puVar10[0x30],puVar10[0x31]);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_a8,(char *)puVar10[3],puVar10[4]);
              }
            }
          }
          source = local_88;
          if (local_a8._M_string_length == 0) {
            local_60 = 3;
            local_58 = "No ";
            local_70._M_len = 0xe;
            local_70._M_str = "s are in-game.";
            jessilib::
            join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_50,(jessilib *)&local_60,&local_80,&local_70,args_2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_a8,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,local_a8._M_string_length);
        }
        uVar9 = uVar9 + 1;
      }
      if (local_a8._M_string_length == 0) {
        Jupiter::IRC::Client::sendMessage
                  (source,sVar6,pcVar5,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
    }
    return;
  }
  nick_00._M_str = pcVar8;
  nick_00._M_len = sVar7;
  ShowModsIRCCommand::trigger(this_00,source,channel,nick_00,parameters);
  return;
}

Assistant:

void ModsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (jessilib::equalsi(parameters, "show"sv)) {
		ShowModsIRCCommand_instance.trigger(source, channel, nick, parameters);
	}
	else {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string msg;
			std::string_view staff_word = pluginInstance.getStaffTitle();
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					msg = "";
					if (server->players.size() != 0) {
						for (auto node = server->players.begin(); node != server->players.end(); ++node) {
							if (node->isBot == false && (!node->adminType.empty() || (node->access != 0 && (!node->gamePrefix.empty() || !node->formatNamePrefix.empty())))) {
								if (!msg.empty()) {
									msg += ", ";
								}
								else {
									msg += staff_word;
									msg += "s in-game: "sv;
								}
								msg += node->gamePrefix;
								msg += node->name;
							}
						}
					}
					if (msg.empty()) {
						msg = jessilib::join<std::string>("No "sv, staff_word, "s are in-game."sv);
					}
					source->sendMessage(channel, msg);
				}
			}
			if (msg.empty()) {
				source->sendMessage(channel,
					"Error: Channel not attached to any connected Renegade X servers."sv);
			}
		}
	}
}